

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeSymbolMap(WasmBinaryWriter *this)

{
  WasmBinaryWriter **wasm;
  WasmBinaryWriter *pWVar1;
  anon_class_16_2_3f216d3b visitor;
  anon_class_16_2_3f216d3b visitor_00;
  anon_class_16_2_3f216d3b write;
  ofstream file;
  WasmBinaryWriter *this_local;
  
  wasm = &write.this;
  std::ofstream::ofstream(wasm,(string *)&this->symbolMap,_S_out);
  visitor.this = (WasmBinaryWriter *)wasm;
  visitor.file = (ofstream *)this;
  pWVar1 = (WasmBinaryWriter *)wasm;
  write.file = (ofstream *)this;
  wasm::ModuleUtils::iterImportedFunctions<wasm::WasmBinaryWriter::writeSymbolMap()::__0>
            ((ModuleUtils *)this->wasm,(Module *)wasm,visitor);
  visitor_00.this = pWVar1;
  visitor_00.file = write.file;
  wasm::ModuleUtils::iterDefinedFunctions<wasm::WasmBinaryWriter::writeSymbolMap()::__0>
            ((ModuleUtils *)this->wasm,(Module *)wasm,visitor_00);
  std::ofstream::close();
  std::ofstream::~ofstream(&write.this);
  return;
}

Assistant:

void WasmBinaryWriter::writeSymbolMap() {
  std::ofstream file(symbolMap);
  auto write = [&](Function* func) {
    file << getFunctionIndex(func->name) << ":" << func->name.str << std::endl;
  };
  ModuleUtils::iterImportedFunctions(*wasm, write);
  ModuleUtils::iterDefinedFunctions(*wasm, write);
  file.close();
}